

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCaseHandle *testCase)

{
  uint64_t *redirectedCerr_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TestCaseInfo *_testInfo;
  IEventListener *pIVar4;
  SectionTracker *pSVar5;
  undefined4 extraout_var;
  byte local_33a;
  TestCaseStats local_2e8;
  undefined1 local_258 [8];
  TestCaseStats statsForOneRun;
  Totals singleRunTotals;
  string oneRunCerr;
  string oneRunCout;
  Totals beforeRunTotals;
  StringRef local_f0;
  NameAndLocationRef local_e0;
  undefined1 local_b0 [8];
  string redirectedCerr;
  string redirectedCout;
  uint64_t testRuns;
  ITracker *rootTracker;
  TestCaseInfo *testInfo;
  Totals prevTotals;
  TestCaseHandle *testCase_local;
  RunContext *this_local;
  
  prevTotals.testCases.skipped = (uint64_t)testCase;
  memcpy(&testInfo,&this->m_totals,0x40);
  _testInfo = TestCaseHandle::getTestCaseInfo((TestCaseHandle *)prevTotals.testCases.skipped);
  pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
  (*pIVar4->_vptr_IEventListener[5])(pIVar4,_testInfo);
  this->m_activeTestCase = (TestCaseHandle *)prevTotals.testCases.skipped;
  pSVar5 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  uVar2 = (*(pSVar5->super_TrackerBase).super_ITracker._vptr_ITracker[5])();
  if ((uVar2 & 1) != 0) {
    iVar3 = (*this->m_config->_vptr_IConfig[0x15])();
    TestCaseTracking::SectionTracker::addInitialFilters
              (pSVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var,iVar3));
    seedRng(this->m_config);
    redirectedCout.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)(redirectedCerr.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_b0);
    do {
      TestCaseTracking::TrackerContext::startCycle(&this->m_trackerContext);
      StringRef::StringRef(&local_f0,&_testInfo->name);
      TestCaseTracking::NameAndLocationRef::NameAndLocationRef
                (&local_e0,local_f0,_testInfo->lineInfo);
      pSVar5 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_e0);
      this->m_testCaseTracker = (ITracker *)pSVar5;
      pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
      (*pIVar4->_vptr_IEventListener[6])(pIVar4,_testInfo,redirectedCout.field_2._8_8_);
      oneRunCout.field_2._8_8_ = (this->m_totals).assertions.passed;
      std::__cxx11::string::string((string *)(oneRunCerr.field_2._M_local_buf + 8));
      redirectedCerr_00 = &singleRunTotals.testCases.skipped;
      std::__cxx11::string::string((string *)redirectedCerr_00);
      runCurrentTest(this,(string *)(oneRunCerr.field_2._M_local_buf + 8),
                     (string *)redirectedCerr_00);
      std::__cxx11::string::operator+=
                ((string *)(redirectedCerr.field_2._M_local_buf + 8),
                 (string *)(oneRunCerr.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)local_b0,(string *)&singleRunTotals.testCases.skipped);
      Totals::delta((Totals *)&statsForOneRun.aborting,&this->m_totals,
                    (Totals *)((long)&oneRunCout.field_2 + 8));
      bVar1 = aborting(this);
      TestCaseStats::TestCaseStats
                ((TestCaseStats *)local_258,_testInfo,(Totals *)&statsForOneRun.aborting,
                 (string *)((long)&oneRunCerr.field_2 + 8),
                 (string *)&singleRunTotals.testCases.skipped,bVar1);
      pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
      (*pIVar4->_vptr_IEventListener[0xf])(pIVar4,local_258,redirectedCout.field_2._8_8_);
      redirectedCout.field_2._8_8_ = redirectedCout.field_2._8_8_ + 1;
      TestCaseStats::~TestCaseStats((TestCaseStats *)local_258);
      std::__cxx11::string::~string((string *)&singleRunTotals.testCases.skipped);
      std::__cxx11::string::~string((string *)(oneRunCerr.field_2._M_local_buf + 8));
      bVar1 = TestCaseTracking::ITracker::isSuccessfullyCompleted(this->m_testCaseTracker);
      local_33a = 0;
      if (!bVar1) {
        bVar1 = aborting(this);
        local_33a = bVar1 ^ 0xff;
      }
    } while ((local_33a & 1) != 0);
    Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)&testInfo);
    bVar1 = TestCaseInfo::expectedToFail(_testInfo);
    if ((bVar1) && ((__return_storage_ptr__->testCases).passed != 0)) {
      (__return_storage_ptr__->assertions).failed = (__return_storage_ptr__->assertions).failed + 1;
      (__return_storage_ptr__->testCases).passed = (__return_storage_ptr__->testCases).passed - 1;
      (__return_storage_ptr__->testCases).failed = (__return_storage_ptr__->testCases).failed + 1;
    }
    Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
    pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->(&this->m_reporter);
    bVar1 = aborting(this);
    TestCaseStats::TestCaseStats
              (&local_2e8,_testInfo,__return_storage_ptr__,
               (string *)((long)&redirectedCerr.field_2 + 8),(string *)local_b0,bVar1);
    (*pIVar4->_vptr_IEventListener[0x10])(pIVar4,&local_2e8);
    TestCaseStats::~TestCaseStats(&local_2e8);
    this->m_activeTestCase = (TestCaseHandle *)0x0;
    this->m_testCaseTracker = (ITracker *)0x0;
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(redirectedCerr.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  __assert_fail("rootTracker.isSectionTracker()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x1485,"Totals Catch::RunContext::runTest(const TestCaseHandle &)");
}

Assistant:

Totals RunContext::runTest(TestCaseHandle const& testCase) {
        const Totals prevTotals = m_totals;

        auto const& testInfo = testCase.getTestCaseInfo();
        m_reporter->testCaseStarting(testInfo);
        m_activeTestCase = &testCase;


        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());

        // We intentionally only seed the internal RNG once per test case,
        // before it is first invoked. The reason for that is a complex
        // interplay of generator/section implementation details and the
        // Random*Generator types.
        //
        // The issue boils down to us needing to seed the Random*Generators
        // with different seed each, so that they return different sequences
        // of random numbers. We do this by giving them a number from the
        // shared RNG instance as their seed.
        //
        // However, this runs into an issue if the reseeding happens each
        // time the test case is entered (as opposed to first time only),
        // because multiple generators could get the same seed, e.g. in
        // ```cpp
        // TEST_CASE() {
        //     auto i = GENERATE(take(10, random(0, 100));
        //     SECTION("A") {
        //         auto j = GENERATE(take(10, random(0, 100));
        //     }
        //     SECTION("B") {
        //         auto k = GENERATE(take(10, random(0, 100));
        //     }
        // }
        // ```
        // `i` and `j` would properly return values from different sequences,
        // but `i` and `k` would return the same sequence, because their seed
        // would be the same.
        // (The reason their seeds would be the same is that the generator
        //  for k would be initialized when the test case is entered the second
        //  time, after the shared RNG instance was reset to the same value
        //  it had when the generator for i was initialized.)
        seedRng( *m_config );

        uint64_t testRuns = 0;
        std::string redirectedCout;
        std::string redirectedCerr;
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocationRef(testInfo.name, testInfo.lineInfo));

            m_reporter->testCasePartialStarting(testInfo, testRuns);

            const auto beforeRunTotals = m_totals;
            std::string oneRunCout, oneRunCerr;
            runCurrentTest(oneRunCout, oneRunCerr);
            redirectedCout += oneRunCout;
            redirectedCerr += oneRunCerr;

            const auto singleRunTotals = m_totals.delta(beforeRunTotals);
            auto statsForOneRun = TestCaseStats(testInfo, singleRunTotals, CATCH_MOVE(oneRunCout), CATCH_MOVE(oneRunCerr), aborting());

            m_reporter->testCasePartialEnded(statsForOneRun, testRuns);
            ++testRuns;
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  CATCH_MOVE(redirectedCout),
                                  CATCH_MOVE(redirectedCerr),
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }